

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall
spv::Builder::addMemberDecoration(Builder *this,Id id,uint member,Decoration decoration,int num)

{
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  pointer *__ptr;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  
  if (decoration != DecorationMax) {
    this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         operator_new(0x60);
    *(undefined ***)
     this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_00b0d9f8;
    *(undefined8 *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = 0;
    *(Op *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) =
         OpMemberDecorate;
    (((_Bit_iterator *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x40))->
    super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
    *(uint *)((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x48) = 0;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
    (((vector<bool,_std::allocator<bool>_> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
    super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(uint *)((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x38) = 0;
    *(_Bit_pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) =
         (_Bit_pointer)0x0;
    *(Block **)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x58) = (Block *)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)this_00.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),3);
    if (*(_Bit_pointer *)
         ((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) ==
        (((vector<bool,_std::allocator<bool>_> *)
         ((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
        super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
        super__Bit_iterator_base._M_p) {
      std::vector<bool,_std::allocator<bool>_>::_M_reallocate
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)this_00.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30),3);
    }
    Instruction::addIdOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,id);
    Instruction::addImmediateOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,member);
    Instruction::addImmediateOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,decoration);
    if (-1 < num) {
      Instruction::addImmediateOperand
                ((Instruction *)
                 this_00.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,num);
    }
    local_38._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    std::
    _Rb_tree<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::_Identity<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::_M_insert_unique<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((_Rb_tree<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::_Identity<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->decorations,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_38._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
  }
  return;
}

Assistant:

void Builder::addMemberDecoration(Id id, unsigned int member, Decoration decoration, int num)
{
    if (decoration == spv::DecorationMax)
        return;

    Instruction* dec = new Instruction(OpMemberDecorate);
    dec->reserveOperands(3);
    dec->addIdOperand(id);
    dec->addImmediateOperand(member);
    dec->addImmediateOperand(decoration);
    if (num >= 0)
        dec->addImmediateOperand(num);

    decorations.insert(std::unique_ptr<Instruction>(dec));
}